

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool bssl::ssl_client_hello_write_without_extensions(SSL_CLIENT_HELLO *client_hello,CBB *out)

{
  int iVar1;
  undefined1 local_50 [8];
  CBB cbb;
  CBB *out_local;
  SSL_CLIENT_HELLO *client_hello_local;
  
  cbb.u._24_8_ = out;
  iVar1 = CBB_add_u16(out,client_hello->version);
  if ((((iVar1 == 0) ||
       (iVar1 = CBB_add_bytes((CBB *)cbb.u._24_8_,client_hello->random,client_hello->random_len),
       iVar1 == 0)) ||
      (iVar1 = CBB_add_u8_length_prefixed((CBB *)cbb.u._24_8_,(CBB *)local_50), iVar1 == 0)) ||
     (iVar1 = CBB_add_bytes((CBB *)local_50,client_hello->session_id,client_hello->session_id_len),
     iVar1 == 0)) {
    client_hello_local._7_1_ = false;
  }
  else {
    iVar1 = SSL_is_dtls(client_hello->ssl);
    if ((iVar1 == 0) ||
       ((iVar1 = CBB_add_u8_length_prefixed((CBB *)cbb.u._24_8_,(CBB *)local_50), iVar1 != 0 &&
        (iVar1 = CBB_add_bytes((CBB *)local_50,client_hello->dtls_cookie,
                               client_hello->dtls_cookie_len), iVar1 != 0)))) {
      iVar1 = CBB_add_u16_length_prefixed((CBB *)cbb.u._24_8_,(CBB *)local_50);
      if ((iVar1 == 0) ||
         (((iVar1 = CBB_add_bytes((CBB *)local_50,client_hello->cipher_suites,
                                  client_hello->cipher_suites_len), iVar1 == 0 ||
           (iVar1 = CBB_add_u8_length_prefixed((CBB *)cbb.u._24_8_,(CBB *)local_50), iVar1 == 0)) ||
          ((iVar1 = CBB_add_bytes((CBB *)local_50,client_hello->compression_methods,
                                  client_hello->compression_methods_len), iVar1 == 0 ||
           (iVar1 = CBB_flush((CBB *)cbb.u._24_8_), iVar1 == 0)))))) {
        client_hello_local._7_1_ = false;
      }
      else {
        client_hello_local._7_1_ = true;
      }
    }
    else {
      client_hello_local._7_1_ = false;
    }
  }
  return client_hello_local._7_1_;
}

Assistant:

static bool ssl_client_hello_write_without_extensions(
    const SSL_CLIENT_HELLO *client_hello, CBB *out) {
  CBB cbb;
  if (!CBB_add_u16(out, client_hello->version) ||
      !CBB_add_bytes(out, client_hello->random, client_hello->random_len) ||
      !CBB_add_u8_length_prefixed(out, &cbb) ||
      !CBB_add_bytes(&cbb, client_hello->session_id,
                     client_hello->session_id_len)) {
    return false;
  }
  if (SSL_is_dtls(client_hello->ssl)) {
    if (!CBB_add_u8_length_prefixed(out, &cbb) ||
        !CBB_add_bytes(&cbb, client_hello->dtls_cookie,
                       client_hello->dtls_cookie_len)) {
      return false;
    }
  }
  if (!CBB_add_u16_length_prefixed(out, &cbb) ||
      !CBB_add_bytes(&cbb, client_hello->cipher_suites,
                     client_hello->cipher_suites_len) ||
      !CBB_add_u8_length_prefixed(out, &cbb) ||
      !CBB_add_bytes(&cbb, client_hello->compression_methods,
                     client_hello->compression_methods_len) ||
      !CBB_flush(out)) {
    return false;
  }
  return true;
}